

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_region.cpp
# Opt level: O3

void __thiscall
Region_OneLargeOneSmallRegion_Test::TestBody(Region_OneLargeOneSmallRegion_Test *this)

{
  _func_int *p_Var1;
  AssertHelperData *pAVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  pointer message;
  char *pcVar3;
  char *in_R9;
  uint8_t *expected;
  void *actual;
  vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
  result;
  shared_ptr<unsigned_char> sp;
  size_t big_region_size;
  size_t file_size;
  size_t small_region_size;
  mem_based_factory factory;
  undefined1 local_e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  AssertHelper local_d8;
  AssertHelper local_d0;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  AssertHelper local_a8;
  AssertHelper local_a0;
  mem_based_factory local_98;
  unsigned_long local_70;
  shared_ptr<pstore::file::in_memory> local_68;
  unsigned_long local_58 [2];
  mem_based_factory local_48;
  
  local_70 = 0x20;
  local_58[1] = 0x10;
  local_58[0] = 0x30;
  anon_unknown.dwarf_2f8390::Region::make_array((Region *)&local_98.file_,0x30);
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
  this_01->_M_use_count = 1;
  this_01->_M_weak_count = 1;
  this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0026fc10;
  __gnu_cxx::new_allocator<pstore::file::in_memory>::
  construct<pstore::file::in_memory,std::shared_ptr<unsigned_char>&,unsigned_long_const&,unsigned_long_const&>
            ((new_allocator<pstore::file::in_memory> *)&local_48,(in_memory *)(this_01 + 1),
             (shared_ptr<unsigned_char> *)&local_98.file_,local_58,local_58);
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_01->_M_use_count = this_01->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_01->_M_use_count = this_01->_M_use_count + 1;
  }
  local_68.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (in_memory *)(this_01 + 1);
  local_68.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = this_01;
  pstore::region::mem_based_factory::mem_based_factory(&local_48,&local_68,0x20,0x10);
  if (local_68.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pstore::region::mem_based_factory::init(&local_98,(EVP_PKEY_CTX *)&local_48);
  local_d8.data_._0_4_ = 2;
  local_e8 = (undefined1  [8])
             ((long)(local_98.super_factory.full_size_ - (long)local_98.super_factory._vptr_factory)
             >> 4);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_c8,"2U","result.size ()",(uint *)&local_d8,(unsigned_long *)local_e8)
  ;
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)local_e8 + 0x10),
               "The region factory did not return exactly 2 regions",0x33);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
               ,0x57,message);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e8 + 8))();
    }
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0019bd95;
    this_02 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_c0;
  }
  else {
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    if ((_func_int **)local_98.super_factory.full_size_ == local_98.super_factory._vptr_factory) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    p_Var1 = *local_98.super_factory._vptr_factory;
    local_e8 = *(undefined1 (*) [8])
                &((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(p_Var1 + 8))->
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ;
    local_e0._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var1 + 0x10);
    if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_e0._M_pi)->_M_use_count = (local_e0._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_e0._M_pi)->_M_use_count = (local_e0._M_pi)->_M_use_count + 1;
      }
    }
    testing::internal::CmpHelperEQ<std::shared_ptr<unsigned_char>,std::shared_ptr<void_const>>
              ((internal *)local_c8,"sp","region0.data ()",
               (shared_ptr<unsigned_char> *)&local_98.file_,(shared_ptr<const_void> *)local_e8);
    if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0._M_pi);
    }
    if (local_c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_e8);
      if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_c0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0x5b,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d8,(Message *)local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_d8);
      if (local_e8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_e8 + 8))();
      }
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    local_d8.data_ = local_d8.data_ & 0xffffffff00000000;
    local_e8 = *(undefined1 (*) [8])
                &((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                   *)(p_Var1 + 0x20))->
                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_c8,"0U","region0.offset ()",(uint *)&local_d8,
               (unsigned_long *)local_e8);
    if (local_c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_e8);
      if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_c0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0x5c,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d8,(Message *)local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_d8);
      if (local_e8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_e8 + 8))();
      }
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    local_e8 = *(undefined1 (*) [8])
                &((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                   *)(p_Var1 + 0x28))->
                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_c8,"big_region_size","region0.size ()",&local_70,
               (unsigned_long *)local_e8);
    if (local_c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_e8);
      if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_c0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0x5d,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d8,(Message *)local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_d8);
      if (local_e8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_e8 + 8))();
      }
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    local_e8[0] = p_Var1[0x18];
    local_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var1[0x18] == (_func_int)0x0) {
      testing::Message::Message((Message *)&local_d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_c8,(internal *)local_e8,(AssertionResult *)"region0.is_writable ()"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0x5e,(char *)CONCAT71(local_c8._1_7_,local_c8[0]));
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_c8._1_7_,local_c8[0]) != &local_b8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_c8._1_7_,local_c8[0]),local_b8._M_allocated_capacity + 1);
      }
      if (local_d8.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_d8.data_ + 8))();
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0._M_pi !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_e0._M_pi);
      }
    }
    if ((ulong)((long)(local_98.super_factory.full_size_ -
                      (long)local_98.super_factory._vptr_factory) >> 4) < 2) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
    }
    p_Var1 = local_98.super_factory._vptr_factory[2];
    local_d8.data_ =
         (AssertHelperData *)
         &(local_98.file_.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->eof_;
    pAVar2 = *(AssertHelperData **)(p_Var1 + 8);
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var1 + 0x10);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    local_a8.data_ = pAVar2;
    testing::internal::CmpHelperEQ<unsigned_char_const*,void_const*>
              ((internal *)local_c8,"expected","actual",(uchar **)&local_d8,&local_a8.data_);
    if (local_c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_e8);
      if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_c0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0x65,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )local_e8 !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(long *)local_e8 + 8))();
      }
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    local_e8 = *(undefined1 (*) [8])
                &((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                   *)(p_Var1 + 0x20))->
                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_c8,"big_region_size","region1.offset ()",&local_70,
               (unsigned_long *)local_e8);
    if (local_c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_e8);
      if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_c0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0x66,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (local_e8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_e8 + 8))();
      }
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    local_e8 = *(undefined1 (*) [8])
                &((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                   *)(p_Var1 + 0x28))->
                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_c8,"small_region_size","region1.size ()",local_58 + 1,
               (unsigned_long *)local_e8);
    if (local_c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_e8);
      if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_c0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
                 ,0x67,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (local_e8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_e8 + 8))();
      }
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    local_e8[0] = p_Var1[0x18];
    local_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var1[0x18] != (_func_int)0x0) goto LAB_0019bd95;
    this_02 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_e0;
    testing::Message::Message((Message *)&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)local_e8,(AssertionResult *)"region1.is_writable ()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_region.cpp"
               ,0x68,(char *)CONCAT71(local_c8._1_7_,local_c8[0]));
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_c8._1_7_,local_c8[0]) != &local_b8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_c8._1_7_,local_c8[0]),local_b8._M_allocated_capacity + 1);
    }
    if (local_d0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_d0.data_ + 8))();
    }
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0._M_pi;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) goto LAB_0019bd95;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_02,local_c0);
LAB_0019bd95:
  std::
  vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
  ::~vector((vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
             *)&local_98);
  if (local_48.file_.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.file_.
               super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  pstore::region::factory::~factory(&local_48.super_factory);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  if (local_98.file_.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.file_.
               super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

TEST_F (Region, OneLargeOneSmallRegion) {
    constexpr std::size_t big_region_size = 32;
    constexpr std::size_t small_region_size = 16;
    constexpr std::size_t file_size = big_region_size + small_region_size;

    auto sp = this->make_array (file_size);
    auto file = std::make_shared<pstore::file::in_memory> (sp, file_size, file_size);

    pstore::region::mem_based_factory factory (file, big_region_size, small_region_size);
    std::vector<std::shared_ptr<pstore::memory_mapper_base>> result = factory.init ();

    ASSERT_EQ (2U, result.size ()) << "The region factory did not return exactly 2 regions";
    {
        auto const & region0 = *(result.at (0));

        EXPECT_EQ (sp, region0.data ());
        EXPECT_EQ (0U, region0.offset ());
        EXPECT_EQ (big_region_size, region0.size ());
        EXPECT_TRUE (region0.is_writable ());
    }
    {
        auto const & region1 = *(result.at (1));
        std::uint8_t const * expected = sp.get () + big_region_size;
        void const * actual = region1.data ().get ();

        EXPECT_EQ (expected, actual);
        EXPECT_EQ (big_region_size, region1.offset ());
        EXPECT_EQ (small_region_size, region1.size ());
        EXPECT_TRUE (region1.is_writable ());
    }
}